

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYRef<signed_char>,ImPlot::TransformerLinLin>
               (GetterXsYs<signed_char> *getter1,GetterXsYRef<signed_char> *getter2,
               TransformerLinLin *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  ImPlotContext *pIVar7;
  long lVar8;
  ImPlotContext *pIVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLin>
  local_58;
  
  pIVar7 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_58.Prims = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_58.Prims = getter1->Count;
    }
    local_58.Getter1 = getter1;
    local_58.Getter2 = getter2;
    local_58.Transformer = transformer;
    local_58.Col = col;
    local_58.Weight = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYRef<signed_char>,ImPlot::TransformerLinLin>>
              (&local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar10 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar10 = getter1->Count;
    }
    if (0 < iVar10) {
      iVar11 = 0;
      pIVar9 = GImPlot;
      do {
        iVar4 = getter1->Count;
        lVar8 = (long)(((getter1->Offset + iVar11) % iVar4 + iVar4) % iVar4) * (long)getter1->Stride
        ;
        iVar4 = transformer->YAxis;
        pIVar6 = pIVar9->CurrentPlot;
        IVar2 = pIVar9->PixelRange[iVar4].Min;
        dVar3 = (pIVar6->XAxis).Range.Min;
        fVar13 = (float)(pIVar9->Mx * ((double)(int)getter1->Xs[lVar8] - dVar3) + (double)IVar2.x);
        fVar14 = (float)(pIVar9->My[iVar4] *
                         ((double)(int)((long)((ulong)(byte)getter1->Ys[lVar8] << 0x38) >> 0x38) -
                         pIVar6->YAxis[iVar4].Range.Min) + (double)IVar2.y);
        local_58.Getter1 = (GetterXsYs<signed_char> *)CONCAT44(fVar14,fVar13);
        iVar5 = getter2->Count;
        IVar2 = pIVar9->PixelRange[iVar4].Min;
        local_60.x = (float)(pIVar9->Mx *
                             ((double)(int)getter2->Xs
                                           [(long)(((getter2->Offset + iVar11) % iVar5 + iVar5) %
                                                  iVar5) * (long)getter2->Stride] - dVar3) +
                            (double)IVar2.x);
        local_60.y = (float)(pIVar9->My[iVar4] * (getter2->YRef - pIVar6->YAxis[iVar4].Range.Min) +
                            (double)IVar2.y);
        pIVar6 = pIVar7->CurrentPlot;
        fVar12 = fVar14;
        if (local_60.y <= fVar14) {
          fVar12 = local_60.y;
        }
        if ((fVar12 < (pIVar6->PlotRect).Max.y) &&
           (fVar12 = (float)(~-(uint)(local_60.y <= fVar14) & (uint)local_60.y |
                            -(uint)(local_60.y <= fVar14) & (uint)fVar14),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar12 && fVar12 != *pfVar1)) {
          fVar12 = fVar13;
          if (local_60.x <= fVar13) {
            fVar12 = local_60.x;
          }
          if ((fVar12 < (pIVar6->PlotRect).Max.x) &&
             (fVar12 = (float)(~-(uint)(local_60.x <= fVar13) & (uint)local_60.x |
                              (uint)fVar13 & -(uint)(local_60.x <= fVar13)),
             (pIVar6->PlotRect).Min.x <= fVar12 && fVar12 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)&local_58,&local_60,col,line_weight);
            pIVar9 = GImPlot;
          }
        }
        iVar11 = iVar11 + 1;
      } while (iVar10 != iVar11);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}